

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.hpp
# Opt level: O0

void __thiscall CorUnix::CThreadSuspensionInfo::CThreadSuspensionInfo(CThreadSuspensionInfo *this)

{
  int local_14;
  CThreadSuspensionInfo *local_10;
  CThreadSuspensionInfo *this_local;
  
  local_10 = this;
  CThreadInfoInitializer::CThreadInfoInitializer(&this->super_CThreadInfoInitializer);
  (this->super_CThreadInfoInitializer)._vptr_CThreadInfoInitializer =
       (_func_int **)&PTR_InitializePreCreate_0047b450;
  this->m_fPending = 0;
  this->m_fSelfsusp = 0;
  this->m_fSuspendedForShutdown = 0;
  this->m_nBlockingPipe = -1;
  local_14 = 0;
  Volatile<int>::Volatile(&this->m_lNumThreadsSuspendedByThisThread,&local_14);
  this->m_fSuspmutexInitialized = 0;
  this->m_fSemaphoresInitialized = 0;
  InitializeSuspensionLock(this);
  return;
}

Assistant:

CThreadSuspensionInfo()
                : m_fPending(FALSE)
                , m_fSelfsusp(FALSE)
                , m_fSuspendedForShutdown(FALSE)
                , m_nBlockingPipe(-1)
#ifdef _DEBUG
                , m_lNumThreadsSuspendedByThisThread(0)
#endif // _DEBUG
#if !DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
                , m_fSuspmutexInitialized(FALSE)
#endif
#if USE_POSIX_SEMAPHORES || USE_PTHREAD_CONDVARS
                , m_fSemaphoresInitialized(FALSE)
#endif
            {
                InitializeSuspensionLock();
            }